

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::BlockReferencedByShaderValidator::validate
          (BlockReferencedByShaderValidator *this,Program *program,string *resource,GLint propValue,
          string *implementationName)

{
  undefined1 *this_00;
  Shader *shader;
  TestContext *this_01;
  uint uVar1;
  Program *this_02;
  bool bVar2;
  int iVar3;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  *pvVar4;
  char *pcVar5;
  size_t sVar6;
  long *plVar7;
  long *plVar8;
  TestLog *pTVar9;
  long lVar10;
  pointer pIVar11;
  bool bVar12;
  bool bVar13;
  long lVar14;
  string blockName;
  allocator<char> local_231;
  BlockReferencedByShaderValidator *local_230;
  uint local_224;
  Program *local_220;
  long local_218;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  string local_1f0;
  long *local_1d0 [2];
  long local_1c0 [2];
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  TestLog local_1a0;
  long lStack_198;
  ios_base local_138 [264];
  
  local_224 = propValue;
  glu::parseVariableName_abi_cxx11_(&local_1f0,(glu *)(resource->_M_dataplus)._M_p,(char *)resource)
  ;
  this_00 = &(this->super_PropValidator).field_0x2c;
  bVar13 = false;
  bVar12 = false;
  lVar10 = 0;
  local_230 = this;
  local_220 = program;
  while (this_02 = local_220, pvVar4 = ProgramInterfaceDefinition::Program::getShaders(local_220),
        lVar10 < (int)((ulong)((long)(pvVar4->
                                     super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar4->
                                    super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    pvVar4 = ProgramInterfaceDefinition::Program::getShaders(this_02);
    shader = (pvVar4->
             super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
             )._M_impl.super__Vector_impl_data._M_start[lVar10];
    bVar2 = ProgramInterfaceDefinition::VariableSearchFilter::matchesFilter
                      ((VariableSearchFilter *)this_00,shader);
    local_218 = lVar10;
    if ((bVar2) &&
       (pIVar11 = (shader->m_defaultBlock).interfaceBlocks.
                  super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>.
                  _M_impl.super__Vector_impl_data._M_start,
       0 < (int)((ulong)((long)(shader->m_defaultBlock).interfaceBlocks.
                               super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar11) >> 4) *
           0x38e38e39)) {
      lVar10 = 0;
      lVar14 = 0;
      do {
        bVar2 = ProgramInterfaceDefinition::VariableSearchFilter::matchesFilter
                          ((VariableSearchFilter *)this_00,
                           (InterfaceBlock *)((long)&(pIVar11->layout).location + lVar10));
        if ((bVar2) &&
           (sVar6 = *(size_t *)((long)&(pIVar11->interfaceName)._M_string_length + lVar10),
           sVar6 == local_1f0._M_string_length)) {
          if (sVar6 == 0) {
            bVar12 = true;
            bVar13 = true;
          }
          else {
            iVar3 = bcmp(*(void **)((long)&(pIVar11->interfaceName)._M_dataplus._M_p + lVar10),
                         local_1f0._M_dataplus._M_p,sVar6);
            bVar12 = bVar13;
            if (iVar3 == 0) {
              bVar12 = true;
              bVar13 = bVar12;
            }
          }
        }
        lVar14 = lVar14 + 1;
        pIVar11 = (shader->m_defaultBlock).interfaceBlocks.
                  super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        lVar10 = lVar10 + 0x90;
      } while (lVar14 < (int)((ulong)((long)(shader->m_defaultBlock).interfaceBlocks.
                                            super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pIVar11) >> 4) * 0x38e38e39);
    }
    lVar10 = local_218 + 1;
  }
  local_1b0 = (undefined1  [8])((local_230->super_PropValidator).m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Verifying referenced by ",0x18);
  pcVar5 = glu::getShaderTypeName(local_230->m_shaderType);
  iVar3 = (int)(ostringstream *)&local_1a8;
  if (pcVar5 == (char *)0x0) {
    std::ios::clear(iVar3 + (int)local_1a8[-3]);
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar5,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8," shader, expecting ",0x13);
  pcVar5 = "mapped_ == GL_FALSE";
  if (bVar12) {
    pcVar5 = "mapped_ == GL_TRUE";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,pcVar5 + 0xb,8 - (ulong)bVar12);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar1 = local_224;
  if (bVar12 != local_224) {
    local_1b0 = (undefined1  [8])((local_230->super_PropValidator).m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"\tError, invalid referenced_by_",0x1e);
    pcVar5 = glu::getShaderTypeName(local_230->m_shaderType);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear(iVar3 + (int)local_1a8[-3]);
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar5,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", got ",6);
    std::ostream::operator<<((ostringstream *)&local_1a8,uVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    pcVar5 = glu::getShaderTypeName(local_230->m_shaderType);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_1d0,pcVar5,&local_231);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)local_1d0,0,(char *)0x0,0x1cb7a0c);
    plVar8 = plVar7 + 2;
    if ((long *)*plVar7 == plVar8) {
      local_200 = *plVar8;
      lStack_1f8 = plVar7[3];
      local_210 = &local_200;
    }
    else {
      local_200 = *plVar8;
      local_210 = (long *)*plVar7;
    }
    local_208 = plVar7[1];
    *plVar7 = (long)plVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_210);
    pTVar9 = (TestLog *)(plVar7 + 2);
    if ((TestLog *)*plVar7 == pTVar9) {
      local_1a0.m_log = pTVar9->m_log;
      lStack_198 = plVar7[3];
      local_1b0 = (undefined1  [8])&local_1a0;
    }
    else {
      local_1a0.m_log = pTVar9->m_log;
      local_1b0 = (undefined1  [8])*plVar7;
    }
    local_1a8 = (_func_int **)plVar7[1];
    *plVar7 = (long)pTVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    this_01 = (local_230->super_PropValidator).m_testCtx;
    if (this_01->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_FAIL,(char *)local_1b0);
    }
    if (local_1b0 != (undefined1  [8])&local_1a0) {
      operator_delete((void *)local_1b0,(ulong)((long)&(local_1a0.m_log)->flags + 1));
    }
    if (local_210 != &local_200) {
      operator_delete(local_210,local_200 + 1);
    }
    if (local_1d0[0] != local_1c0) {
      operator_delete(local_1d0[0],local_1c0[0] + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void BlockReferencedByShaderValidator::validate (const ProgramInterfaceDefinition::Program* program, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	const std::string	blockName			= glu::parseVariableName(resource.c_str());
	bool				referencedByShader	= false;

	DE_UNREF(implementationName);

	for (int shaderNdx = 0; shaderNdx < (int)program->getShaders().size(); ++shaderNdx)
	{
		const ProgramInterfaceDefinition::Shader* const shader = program->getShaders()[shaderNdx];
		if (!m_filter.matchesFilter(shader))
			continue;

		for (int blockNdx = 0; blockNdx < (int)shader->getDefaultBlock().interfaceBlocks.size(); ++blockNdx)
		{
			const glu::InterfaceBlock& block = shader->getDefaultBlock().interfaceBlocks[blockNdx];

			if (m_filter.matchesFilter(block) && block.interfaceName == blockName)
				referencedByShader = true;
		}
	}

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Verifying referenced by " << glu::getShaderTypeName(m_shaderType) << " shader, expecting "
		<< ((referencedByShader) ? ("GL_TRUE") : ("GL_FALSE"))
		<< tcu::TestLog::EndMessage;

	if (propValue != ((referencedByShader) ? (1) : (0)))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "\tError, invalid referenced_by_" << glu::getShaderTypeName(m_shaderType) << ", got " << propValue << tcu::TestLog::EndMessage;
		setError("referenced_by_" + std::string(glu::getShaderTypeName(m_shaderType)) + " invalid");
	}
}